

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxxopts.hpp
# Opt level: O0

void __thiscall cxxopts::option_exists_error::~option_exists_error(option_exists_error *this)

{
  void *in_RDI;
  
  ~option_exists_error((option_exists_error *)0x13ceb8);
  operator_delete(in_RDI,0x28);
  return;
}

Assistant:

option_exists_error(const std::string& option)
                : OptionSpecException(u8"Option " + LQUOTE + option + RQUOTE + u8" already exists")
        {
        }